

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VRDatum.cpp
# Opt level: O2

ostream * MinVR::operator<<(ostream *os,VRDatumPtr *p)

{
  ostream *poVar1;
  string local_30 [32];
  
  (*p->pData->_vptr_VRDatum[2])(local_30);
  poVar1 = std::operator<<(os,local_30);
  std::__cxx11::string::~string(local_30);
  return poVar1;
}

Assistant:

std::ostream & operator<<(std::ostream &os, VRDatumPtr& p) {
  return os << p->getValueString();
}